

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeBuilder::align(CodeBuilder *this,uint32_t mode,uint32_t alignment)

{
  CBAlign *pCVar1;
  uint32_t in_EDX;
  uint32_t in_ESI;
  CodeBuilder *in_RDI;
  CBAlign *node;
  undefined4 in_stack_fffffffffffffff8;
  Error EVar2;
  
  if ((in_RDI->super_CodeEmitter)._lastError == 0) {
    pCVar1 = newAlignNode(in_RDI,in_ESI,in_EDX);
    if (pCVar1 == (CBAlign *)0x0) {
      EVar2 = CodeEmitter::setLastError
                        ((CodeEmitter *)CONCAT44(1,in_stack_fffffffffffffff8),
                         (Error)((ulong)in_RDI >> 0x20),(char *)CONCAT44(in_ESI,in_EDX));
    }
    else {
      addNode(in_RDI,(CBNode *)CONCAT44(in_ESI,in_EDX));
      EVar2 = 0;
    }
  }
  else {
    EVar2 = (in_RDI->super_CodeEmitter)._lastError;
  }
  return EVar2;
}

Assistant:

Error CodeBuilder::align(uint32_t mode, uint32_t alignment) {
  if (_lastError) return _lastError;

  CBAlign* node = newAlignNode(mode, alignment);
  if (ASMJIT_UNLIKELY(!node))
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

  addNode(node);
  return kErrorOk;
}